

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

KdTreeAggregate *
pbrt::KdTreeAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int traversalCost;
  int maxPrims;
  int maxDepth;
  KdTreeAggregate *this;
  string local_70;
  Float local_50;
  int local_4c;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_48;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"intersectcost","");
  local_4c = ParameterDictionary::GetOneInt(parameters,&local_70,0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"traversalcost","");
  traversalCost = ParameterDictionary::GetOneInt(parameters,&local_70,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"emptybonus","");
  local_50 = ParameterDictionary::GetOneFloat(parameters,&local_70,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"maxprims","");
  maxPrims = ParameterDictionary::GetOneInt(parameters,&local_70,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt(parameters,&local_70,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this = (KdTreeAggregate *)operator_new(0x68);
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_start =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KdTreeAggregate(this,&local_48,local_4c,traversalCost,local_50,maxPrims,maxDepth);
  if (local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

KdTreeAggregate *KdTreeAggregate::Create(std::vector<PrimitiveHandle> prims,
                                         const ParameterDictionary &parameters) {
    int isectCost = parameters.GetOneInt("intersectcost", 80);
    int travCost = parameters.GetOneInt("traversalcost", 1);
    Float emptyBonus = parameters.GetOneFloat("emptybonus", 0.5f);
    int maxPrims = parameters.GetOneInt("maxprims", 1);
    int maxDepth = parameters.GetOneInt("maxdepth", -1);
    return new KdTreeAggregate(std::move(prims), isectCost, travCost, emptyBonus,
                               maxPrims, maxDepth);
}